

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Dumper::appendUInt(Dumper *this,uint64_t v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  
  if (v < 10000000000000000000) {
    if (999999999999999999 < v) goto LAB_00109cd2;
    if (99999999999999999 < v) goto LAB_00109d07;
    if (9999999999999999 < v) goto LAB_00109d3f;
    if (999999999999999 < v) goto LAB_00109d74;
    if (99999999999999 < v) goto LAB_00109dad;
    if (0x48c27394 < v >> 0xd) goto LAB_00109de3;
    if (0xe8d4a50 < v >> 0xc) goto LAB_00109e19;
    if (0x2e90edc < v >> 0xb) goto LAB_00109e4f;
    if (0x9502f8 < v >> 10) goto LAB_00109e85;
    if (999999999 < v) goto LAB_00109ebb;
    if (99999999 < v) goto LAB_00109ef3;
    if (9999999 < v) goto LAB_00109f27;
    if (999999 < v) goto LAB_00109f5b;
    if (99999 < v) goto LAB_00109f8f;
    if (9999 < v) goto LAB_00109fc7;
    if (999 < v) goto LAB_00109ffb;
    if (99 < v) goto LAB_0010a033;
    if (v < 10) goto LAB_0010a095;
  }
  else {
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x31);
LAB_00109cd2:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = v >> 0x12;
    bVar15 = SUB161(auVar1 * ZEXT816(0x49c97747490f),0xb);
    bVar14 = bVar15 - 10;
    if (v < 10000000000000000000) {
      bVar14 = bVar15;
    }
    (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(uint)(int)(char)(bVar14 | 0x30));
LAB_00109d07:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = v >> 0x11;
    uVar16 = SUB164(auVar2 * ZEXT816(0x5c3bd5191b53),8) >> 0x16;
    uVar13 = (ulong)CONCAT31(SUB163(auVar2 * ZEXT816(0x5c3bd5191b53),9) >> 0x16,
                             (char)uVar16 + ((byte)(uVar16 / 5) & 0xfe) * -5);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_00109d3f:
    uVar16 = (uint)(v / 10000000000000000);
    uVar13 = (ulong)(uVar16 + (uVar16 / 5 & 0xfffffffe) * -5);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_00109d74:
    uVar16 = (uint)(v / 1000000000000000);
    uVar13 = (ulong)(uVar16 + (uVar16 / 5 & 0xfffffffe) * -5);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_00109dad:
    uVar13 = (ulong)(uint)((int)(v / 100000000000000) + (int)((v / 100000000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_00109de3:
    uVar13 = (ulong)(uint)((int)(v / 10000000000000) + (int)((v / 10000000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_00109e19:
    uVar13 = (ulong)(uint)((int)(v / 1000000000000) + (int)((v / 1000000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_00109e4f:
    uVar13 = (ulong)(uint)((int)(v / 100000000000) + (int)((v / 100000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_00109e85:
    uVar13 = (ulong)(uint)((int)(v / 10000000000) + (int)((v / 10000000000) / 10) * -10);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar13 & 0xff | 0x30,uVar13 | 0x30);
LAB_00109ebb:
    auVar3._8_8_ = 0;
    auVar3._0_8_ = v / 1000000000;
    iVar17 = SUB164(auVar3 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)(v / 1000000000) + iVar17 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
LAB_00109ef3:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = v / 100000000;
    iVar17 = SUB164(auVar4 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)(v / 100000000) + iVar17 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
LAB_00109f27:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = v / 10000000;
    iVar17 = SUB164(auVar5 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)(v / 10000000) + iVar17 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
LAB_00109f5b:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = v / 1000000;
    iVar17 = SUB164(auVar6 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)(v / 1000000) + iVar17 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
LAB_00109f8f:
    auVar7._8_8_ = 0;
    auVar7._0_8_ = v / 100000;
    iVar17 = SUB164(auVar7 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)(v / 100000) + iVar17 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
LAB_00109fc7:
    auVar8._8_8_ = 0;
    auVar8._0_8_ = v / 10000;
    iVar17 = SUB164(auVar8 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)(v / 10000) + iVar17 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
LAB_00109ffb:
    auVar9._8_8_ = 0;
    auVar9._0_8_ = v / 1000;
    iVar17 = SUB164(auVar9 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)(v / 1000) + iVar17 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
LAB_0010a033:
    auVar10._8_8_ = 0;
    auVar10._0_8_ = v / 100;
    iVar17 = SUB164(auVar10 * ZEXT816(0x199999999999999a),8);
    uVar13 = (ulong)(uint)((int)(v / 100) + iVar17 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = v / 10;
  iVar17 = SUB164(auVar11 * ZEXT816(0x199999999999999a),8);
  uVar13 = (ulong)(uint)((int)(v / 10) + iVar17 * -10);
  (*this->_sink->_vptr_Sink[2])
            (this->_sink,uVar13 & 0xff | 0x30,(ulong)(uint)(iVar17 * 2),uVar13 | 0x30);
LAB_0010a095:
  auVar12._8_8_ = 0;
  auVar12._0_8_ = v;
  (*this->_sink->_vptr_Sink[2])
            (this->_sink,
             (ulong)(byte)((char)v + ((byte)(SUB164(auVar12 * ZEXT816(0xcccccccccccccccd),8) >> 2) &
                                     0xfe) * -5 | 0x30));
  return;
}

Assistant:

void Dumper::appendUInt(uint64_t v) {
  if (10000000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000000000ULL) % 10);
  }
  if (1000000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000000000ULL) % 10);
  }
  if (100000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000000000ULL) % 10);
  }
  if (10000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000000ULL) % 10);
  }
  if (1000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000000ULL) % 10);
  }
  if (100000000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000000ULL) % 10);
  }
  if (10000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000ULL) % 10);
  }
  if (1000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000ULL) % 10);
  }
  if (100000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000ULL) % 10);
  }
  if (10000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000ULL) % 10);
  }
  if (1000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000ULL) % 10);
  }
  if (100000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000ULL) % 10);
  }
  if (10000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000ULL) % 10);
  }
  if (1000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000ULL) % 10);
  }
  if (100000ULL <= v) {
    _sink->push_back('0' + (v / 100000ULL) % 10);
  }
  if (10000ULL <= v) {
    _sink->push_back('0' + (v / 10000ULL) % 10);
  }
  if (1000ULL <= v) {
    _sink->push_back('0' + (v / 1000ULL) % 10);
  }
  if (100ULL <= v) {
    _sink->push_back('0' + (v / 100ULL) % 10);
  }
  if (10ULL <= v) {
    _sink->push_back('0' + (v / 10ULL) % 10);
  }

  _sink->push_back('0' + (v % 10));
}